

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O0

bool iDynTree::stringToDoubleWithClassicLocale(string *inStr,double *outDouble)

{
  byte bVar1;
  double *in_RSI;
  undefined8 in_RDI;
  istringstream ss;
  locale local_198 [8];
  istringstream local_190 [384];
  double *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream(local_190,in_RDI,8);
  std::locale::classic();
  std::ios::imbue(local_198);
  std::locale::~locale(local_198);
  std::istream::operator>>((istream *)local_190,local_10);
  bVar1 = std::ios::fail();
  std::__cxx11::istringstream::~istringstream(local_190);
  return (bool)((bVar1 ^ 0xff) & 1);
}

Assistant:

bool inline stringToDoubleWithClassicLocale(const std::string & inStr, double & outDouble)
{
    std::istringstream ss(inStr);
    ss.imbue(std::locale::classic());
    ss >> outDouble;
    return !(ss.fail());
}